

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall
hwtest::pgraph::MthdCelsiusClipRectVert::~MthdCelsiusClipRectVert(MthdCelsiusClipRectVert *this)

{
  pointer pcVar1;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test
       = (_func_int **)&PTR__SingleMthdTest_00348698;
  pcVar1 = (this->super_SingleMthdTest).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SingleMthdTest).name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			val &= 0xffff;
			val *= 0x00010001;
		}
		if (rnd() & 1) {
			val &= 0x0fff0fff;
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
				if (rnd() & 1) {
					val |= 1 << (rnd() & 0x1f);
				}
			}
		}
	}